

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  cmake *pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  pointer pcVar6;
  pointer filename;
  pointer pcVar7;
  bool bVar8;
  string local_228;
  string temp;
  string local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream msg;
  size_t local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  GetExecutionFilePath_abi_cxx11_(&local_228,this);
  cmsys::SystemTools::GetFilenameName(&local_1e8,&local_228);
  filename = (pcVar1->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (filename ==
      (pcVar1->TraceOnlyThisSources).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00277ce5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&msg,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):  ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&msg,(lff->super_cmCommandContext).Name._M_dataplus._M_p,
                        (lff->super_cmCommandContext).Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    bVar8 = this->GlobalGenerator->CMakeInstance->TraceExpand;
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    pcVar7 = (lff->Arguments).
             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar7 != (lff->Arguments).
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar6 = pcVar7;
        if (bVar8 != false) {
          std::__cxx11::string::_M_assign((string *)&temp);
          ExpandVariablesInString(this,&temp,false,false,false,(char *)0x0,-1,false,false);
          pcVar6 = (pointer)&temp;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&msg,(pcVar6->Value)._M_dataplus._M_p,(pcVar6->Value)._M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg," ",1);
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != (lff->Arguments).
                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,")",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((char *)local_1c8,(char *)0x0);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp._M_dataplus._M_p != &temp.field_2) {
      operator_delete(temp._M_dataplus._M_p,
                      CONCAT71(temp.field_2._M_allocated_capacity._1_7_,temp.field_2._M_local_buf[0]
                              ) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    std::ios_base::~ios_base(local_138);
  }
  else if (filename !=
           (pcVar1->TraceOnlyThisSources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      lVar4 = std::__cxx11::string::rfind
                        ((char *)&local_228,(ulong)(filename->_M_dataplus)._M_p,0xffffffffffffffff);
      if ((lVar4 != -1) && (lVar4 + filename->_M_string_length == local_228._M_string_length)) {
        cmsys::SystemTools::GetFilenameName((string *)&msg,filename);
        _Var2._M_p = _msg;
        if (local_1e8._M_string_length == local_1a0) {
          if (local_1e8._M_string_length == 0) {
            bVar8 = true;
          }
          else {
            iVar3 = bcmp(local_1e8._M_dataplus._M_p,_msg,local_1e8._M_string_length);
            bVar8 = iVar3 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != local_198) {
          operator_delete(_Var2._M_p,local_198[0]._M_allocated_capacity + 1);
        }
        if (bVar8) goto LAB_00277ce5;
      }
      filename = filename + 1;
    } while (filename !=
             (pcVar1->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::vector<std::string>::const_iterator i =
           trace_only_this_files.begin();
         !trace && i != trace_only_this_files.end(); ++i) {
      std::string::size_type const pos = full_path.rfind(*i);
      trace = (pos != std::string::npos) &&
        ((pos + i->size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(*i));
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (std::vector<cmListFileArgument>::const_iterator i =
         lff.Arguments.begin();
       i != lff.Arguments.end(); ++i) {
    if (expand) {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << i->Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}